

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

ctmbstr GetFPIFromVers(uint vers)

{
  uint local_18;
  uint i;
  uint vers_local;
  
  local_18 = 0;
  while( true ) {
    if (W3C_Doctypes[local_18].name == (ctmbstr)0x0) {
      return (ctmbstr)0x0;
    }
    if (W3C_Doctypes[local_18].vers == vers) break;
    local_18 = local_18 + 1;
  }
  return W3C_Doctypes[local_18].fpi;
}

Assistant:

static ctmbstr GetFPIFromVers(uint vers)
{
    uint i;

    for (i = 0; W3C_Doctypes[i].name; ++i)
        if (W3C_Doctypes[i].vers == vers)
            return W3C_Doctypes[i].fpi;

    return NULL;
}